

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  VdbeOp *pVVar1;
  u8 uVar2;
  int iVar3;
  uint dest;
  TriggerPrg *pTVar4;
  SubProgram *pSVar5;
  Parse *pParse_00;
  Vdbe *pVVar6;
  char *zP4;
  Expr *pEVar7;
  SrcList *pSVar8;
  ExprList *pEVar9;
  IdList *pColumn;
  Select *pSVar10;
  Parse *pPVar11;
  TriggerStep *pStep;
  SelectDest local_78;
  NameContext local_68;
  
  pPVar11 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar11 = pParse;
  }
  pTVar4 = pPVar11->pTriggerPrg;
  while( true ) {
    if (pTVar4 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar4 = (TriggerPrg *)sqlite3DbMallocRaw(db,0x28);
      if (pTVar4 != (TriggerPrg *)0x0) {
        pTVar4->pProgram = (SubProgram *)0x0;
        pTVar4->orconf = 0;
        pTVar4->aColmask[0] = 0;
        pTVar4->pTrigger = (Trigger *)0x0;
        pTVar4->pNext = (TriggerPrg *)0x0;
        *(undefined8 *)(pTVar4->aColmask + 1) = 0;
        pTVar4->pNext = pPVar11->pTriggerPrg;
        pPVar11->pTriggerPrg = pTVar4;
        pSVar5 = (SubProgram *)sqlite3DbMallocRaw(db,0x28);
        if (pSVar5 == (SubProgram *)0x0) {
          pTVar4->pProgram = (SubProgram *)0x0;
        }
        else {
          pSVar5->nCsr = 0;
          pSVar5->nOnce = 0;
          pSVar5->token = (void *)0x0;
          pSVar5->aOp = (VdbeOp *)0x0;
          pSVar5->nOp = 0;
          pSVar5->nMem = 0;
          pSVar5->pNext = (SubProgram *)0x0;
          pTVar4->pProgram = pSVar5;
          pVVar6 = pPVar11->pVdbe;
          pSVar5->pNext = pVVar6->pProgram;
          pVVar6->pProgram = pSVar5;
          pTVar4->pTrigger = pTrigger;
          pTVar4->orconf = orconf;
          pTVar4->aColmask[0] = 0xffffffff;
          pTVar4->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocRaw(db,0x298);
          if (pParse_00 != (Parse *)0x0) {
            dest = 0;
            memset(pParse_00,0,0x298);
            local_68.pSrcList = (SrcList *)0x0;
            local_68.pEList = (ExprList *)0x0;
            local_68.pAggInfo = (AggInfo *)0x0;
            local_68.pNext = (NameContext *)0x0;
            local_68.nRef = 0;
            local_68.nErr = 0;
            local_68.ncFlags = '\0';
            local_68._49_7_ = 0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar11;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            local_68.pParse = pParse_00;
            pVVar6 = sqlite3GetVdbe(pParse_00);
            if (pVVar6 != (Vdbe *)0x0) {
              zP4 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar6,-1,zP4,-1);
              if (pTrigger->pWhen != (Expr *)0x0) {
                dest = 0;
                pEVar7 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
                iVar3 = sqlite3ResolveExprNames(&local_68,pEVar7);
                if ((iVar3 == 0) && (db->mallocFailed == '\0')) {
                  dest = sqlite3VdbeMakeLabel(pVVar6);
                  sqlite3ExprIfFalse(pParse_00,pEVar7,dest,8);
                }
                sqlite3ExprDelete(db,pEVar7);
              }
              pStep = pTrigger->step_list;
              if (pStep != (TriggerStep *)0x0) {
                db_00 = pParse_00->db;
                p = pParse_00->pVdbe;
                do {
                  uVar2 = (u8)orconf;
                  if (orconf == 99) {
                    uVar2 = pStep->orconf;
                  }
                  pParse_00->eOrconf = uVar2;
                  pParse_00->cookieGoto = 0;
                  uVar2 = pStep->op;
                  if (uVar2 == 'i') {
                    pSVar8 = targetSrcList(pParse_00,pStep);
                    pEVar9 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    pSVar10 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                    sqlite3Insert(pParse_00,pSVar8,pEVar9,pSVar10,pColumn,(uint)pParse_00->eOrconf);
                  }
                  else if (uVar2 == 'j') {
                    pSVar8 = targetSrcList(pParse_00,pStep);
                    pEVar7 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    sqlite3DeleteFrom(pParse_00,pSVar8,pEVar7);
                  }
                  else if (uVar2 == 'k') {
                    pSVar8 = targetSrcList(pParse_00,pStep);
                    pEVar9 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    pEVar7 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    sqlite3Update(pParse_00,pSVar8,pEVar9,pEVar7,(uint)pParse_00->eOrconf);
                  }
                  else {
                    pSVar10 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    local_78.eDest = '\x04';
                    local_78.affSdst = '\0';
                    local_78.iSDParm = 0;
                    local_78.iSdst = 0;
                    local_78.nSdst = 0;
                    sqlite3Select(pParse_00,pSVar10,&local_78);
                    sqlite3SelectDelete(db_00,pSVar10);
                  }
                  if (pStep->op != 't') {
                    sqlite3VdbeAddOp3(p,0x3c,0,0,0);
                  }
                  pStep = pStep->pNext;
                } while (pStep != (TriggerStep *)0x0);
              }
              if ((dest != 0) && (pVVar6->aLabel != (int *)0x0)) {
                pVVar6->aLabel[(int)~dest] = pVVar6->nOp;
              }
              sqlite3VdbeAddOp3(pVVar6,6,0,0,0);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if (db->mallocFailed == '\0') {
                pVVar1 = pVVar6->aOp;
                resolveP2Values(pVVar6,&pPVar11->nMaxArg);
                pSVar5->nOp = pVVar6->nOp;
                pVVar6->aOp = (Op *)0x0;
                pSVar5->aOp = pVVar1;
              }
              pSVar5->nMem = pParse_00->nMem;
              pSVar5->nCsr = pParse_00->nTab;
              pSVar5->nOnce = pParse_00->nOnce;
              pSVar5->token = pTrigger;
              pTVar4->aColmask[0] = pParse_00->oldmask;
              pTVar4->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar6);
            }
            sqlite3DbFree(db,pParse_00);
            return pTVar4;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar4->pTrigger == pTrigger) && (pTVar4->orconf == orconf)) break;
    pTVar4 = pTVar4->pNext;
  }
  return pTVar4;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}